

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

float __thiscall CProficiencies::ProfEffect(CProficiencies *this,char *profname,float nArg)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  float fVar4;
  
  sVar2 = ProfIndexLookup(profname);
  fVar4 = 0.0;
  if (sVar2 != -1) {
    bVar1 = str_cmp(profname,"appraising");
    if (bVar1) {
      bVar1 = str_cmp(profname,"trap detecting");
      if (bVar1) {
        bVar1 = str_cmp(profname,"firestarting");
        fVar4 = 0.0;
        if (!bVar1) {
          fVar4 = (nArg + 25.0) / 25.0;
        }
      }
      else {
        iVar3 = number_range(-2,8);
        fVar4 = (float)(iVar3 + this->profs[sVar2]);
      }
    }
    else {
      CheckImprove(this,profname,0x32);
      fVar4 = (float)(this->profs[sVar2] * -2 + 0x5a);
    }
  }
  return fVar4;
}

Assistant:

float CProficiencies::ProfEffect(char *profname, float nArg)
{
	int pindex = ProfIndexLookup(profname);
	if (pindex == -1)
		return 0;

	if (!str_cmp(profname, "appraising"))
	{
		CheckImprove(profname, 50);
		return 100 - ((profs[pindex] * 2) + 10); // 12% off at 1, 30% at 10
	}

	if (!str_cmp(profname, "trap detecting"))
	{
		//returned value needs to be >= than quality of the trap to detect its presence
		//if you have a skill of 1 and a trap of 5, you need a rnd >=4 (40% chance)
		//if you have a skill of 1 and a trap of 9, you need a rnd =8 (10% chance)
		//if you have a skill of 1 and a trap of 1, you need a rnd >=0 (80% chance)
		//that's for detection in adjacent room, to avoid the trap as it fires the chance is detect / 2
		return number_range(-2, 8) + profs[pindex];
	}

	if (!str_cmp(profname, "firestarting"))
	{
		return (nArg + 25) / 25; // multiplied by gain to get hp gain
	}

	return 0;
}